

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O2

bool __thiscall packing::AssignedProtos::canFit(AssignedProtos *this,ProtoPalette *protoPal)

{
  _Insert_base<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *this_00;
  const_iterator __first;
  const_iterator __last;
  
  this_00 = (_Insert_base<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)uniqueColors(this);
  __first = ProtoPalette::begin(protoPal);
  __last = ProtoPalette::end(protoPal);
  std::__detail::
  _Insert_base<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::insert<unsigned_short_const*>(this_00,__first,__last);
  return *(ulong *)(this_00 + 0x18) <=
         (ulong)(byte)(options.nbColorsPerPal - options.hasTransparentPixels);
}

Assistant:

bool canFit(ProtoPalette const &protoPal) const {
		auto &colors = uniqueColors();
		colors.insert(protoPal.begin(), protoPal.end());
		return colors.size() <= options.maxOpaqueColors();
	}